

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Prog * re2::Compiler::CompileSet(Regexp *re,Anchor anchor,int64_t max_mem)

{
  Regexp *re_00;
  Frag b;
  Frag a;
  Prog *this;
  bool dfa_failed;
  StringPiece sp;
  Compiler c;
  
  Compiler(&c);
  Setup(&c,(uint)re->parse_flags_,max_mem,anchor);
  re_00 = Regexp::Simplify(re);
  if (re_00 != (Regexp *)0x0) {
    b = Regexp::Walker<re2::Frag>::WalkExponential
                  (&c.super_Walker<re2::Frag>,re_00,(Frag)0x0,c.max_ninst_ * 2);
    Regexp::Decref(re_00);
    if (c.failed_ == false) {
      (c.prog_)->anchor_start_ = true;
      (c.prog_)->anchor_end_ = true;
      if (anchor == UNANCHORED) {
        a = DotStar(&c);
        b = Cat(&c,a,b);
      }
      (c.prog_)->start_ = b.begin;
      (c.prog_)->start_unanchored_ = b.begin;
      this = Finish(&c);
      if (this != (Prog *)0x0) {
        dfa_failed = false;
        sp.data_ = "hello, world";
        sp.size_ = 0xc;
        Prog::SearchDFA(this,&sp,&sp,kAnchored,kManyMatch,(StringPiece *)0x0,&dfa_failed,
                        (SparseSet *)0x0);
        if (dfa_failed != true) goto LAB_001a1008;
        Prog::~Prog(this);
        operator_delete(this);
      }
    }
  }
  this = (Prog *)0x0;
LAB_001a1008:
  ~Compiler(&c);
  return this;
}

Assistant:

Prog* Compiler::CompileSet(Regexp* re, RE2::Anchor anchor, int64_t max_mem) {
  Compiler c;
  c.Setup(re->parse_flags(), max_mem, anchor);

  Regexp* sre = re->Simplify();
  if (sre == NULL)
    return NULL;

  Frag all = c.WalkExponential(sre, Frag(), 2*c.max_ninst_);
  sre->Decref();
  if (c.failed_)
    return NULL;

  c.prog_->set_anchor_start(true);
  c.prog_->set_anchor_end(true);

  if (anchor == RE2::UNANCHORED) {
    // Prepend .* or else the expression will effectively be anchored.
    // Complemented by the ANCHOR_BOTH case in PostVisit().
    all = c.Cat(c.DotStar(), all);
  }
  c.prog_->set_start(all.begin);
  c.prog_->set_start_unanchored(all.begin);

  Prog* prog = c.Finish();
  if (prog == NULL)
    return NULL;

  // Make sure DFA has enough memory to operate,
  // since we're not going to fall back to the NFA.
  bool dfa_failed = false;
  StringPiece sp = "hello, world";
  prog->SearchDFA(sp, sp, Prog::kAnchored, Prog::kManyMatch,
                  NULL, &dfa_failed, NULL);
  if (dfa_failed) {
    delete prog;
    return NULL;
  }

  return prog;
}